

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptorProto::EnumValueDescriptorProto
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *from)

{
  InternalMetadata *this_00;
  uint uVar1;
  ulong uVar2;
  EnumValueOptions *from_00;
  LogMessage *other;
  EnumValueOptions *this_01;
  undefined8 *puVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueDescriptorProto_004e2450;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  (this->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    uVar2 = this_00->ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if (((uVar1 & 2) != 0) && (from->options_ == (EnumValueOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x2be4);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((uVar1 & 2) == 0) {
    this_01 = (EnumValueOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_01 = (EnumValueOptions *)operator_new(0x50);
    EnumValueOptions::EnumValueOptions(this_01,from_00);
  }
  this->options_ = this_01;
  this->number_ = from->number_;
  return;
}

Assistant:

EnumValueDescriptorProto::EnumValueDescriptorProto(const EnumValueDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_options()) {
    options_ = new ::PROTOBUF_NAMESPACE_ID::EnumValueOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  number_ = from.number_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumValueDescriptorProto)
}